

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entt.hpp
# Opt level: O2

Transform * __thiscall
entt::basic_registry<entt::entity>::pool_handler<Transform>::replace<Transform_const&>
          (pool_handler<Transform> *this,basic_registry<entt::entity> *registry,entity entt,
          Transform *args)

{
  object_type *poVar1;
  Transform component;
  Transform local_38;
  
  local_38.m_scale.field_1 = (args->m_scale).field_1;
  local_38.m_scale.field_2 = (args->m_scale).field_2;
  local_38.m_position.field_0 = (args->m_position).field_0;
  local_38.m_position.field_1 = (args->m_position).field_1;
  local_38._8_8_ = *(undefined8 *)&(args->m_position).field_2;
  sigh<void_(entt::entity,_entt::basic_registry<entt::entity>_&,_Transform_&)>::publish
            (&this->update,entt,registry,&local_38);
  poVar1 = basic_storage<entt::entity,_Transform,_void>::get
                     ((basic_storage<entt::entity,_Transform,_void> *)this,entt);
  (poVar1->m_position).field_0 = local_38.m_position.field_0;
  (poVar1->m_position).field_1 = local_38.m_position.field_1;
  *(undefined8 *)&(poVar1->m_position).field_2 = local_38._8_8_;
  (poVar1->m_scale).field_1 = local_38.m_scale.field_1;
  (poVar1->m_scale).field_2 = local_38.m_scale.field_2;
  return poVar1;
}

Assistant:

decltype(auto) replace(basic_registry &registry, const Entity entt, Args &&... args) {
            if constexpr(std::is_empty_v<Component>) {
                ENTT_ASSERT((storage<Entity, Component>::has(entt)));
                update.publish(entt, registry, Component{});
                return Component{std::forward<Args>(args)...};
            } else {
                Component component{std::forward<Args>(args)...};
                update.publish(entt, registry, component);
                return (storage<Entity, Component>::get(entt) = std::move(component));
            }
        }